

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

MSize var_lookup_(FuncState *fs,GCstr *name,ExpDesc *e,int first)

{
  BCReg level;
  uint uVar1;
  MSize MVar2;
  MSize MVar3;
  int in_ECX;
  GCstr *in_RDX;
  FuncState *in_RSI;
  FuncState *in_RDI;
  MSize vidx;
  BCReg reg;
  int in_stack_ffffffffffffffb4;
  
  if (in_RDI == (FuncState *)0x0) {
    in_RDX->hash = 8;
    (in_RDX->nextgc).gcptr32 = 0;
    in_RDX->len = 0xffffffff;
    in_RDX[1].nextgc.gcptr32 = 0xffffffff;
    *(FuncState **)in_RDX = in_RSI;
  }
  else {
    level = var_lookup_local(in_RDI,(GCstr *)in_RSI);
    if (-1 < (int)level) {
      in_RDX->hash = 6;
      (in_RDX->nextgc).gcptr32 = level;
      in_RDX->len = 0xffffffff;
      in_RDX[1].nextgc.gcptr32 = 0xffffffff;
      if (in_ECX == 0) {
        fscope_uvmark(in_RDI,level);
      }
      uVar1 = (uint)in_RDI->varmap[level];
      in_RDX->marked = (char)uVar1;
      in_RDX->gct = (char)(uVar1 >> 8);
      in_RDX->reserved = (char)(uVar1 >> 0x10);
      in_RDX->strflags = (char)(uVar1 >> 0x18);
      return uVar1;
    }
    MVar2 = var_lookup_(in_RSI,in_RDX,(ExpDesc *)CONCAT44(in_ECX,level),in_stack_ffffffffffffffb4);
    if (-1 < (int)MVar2) {
      MVar3 = var_lookup_uv(in_RSI,(MSize)((ulong)in_RDX >> 0x20),(ExpDesc *)CONCAT44(in_ECX,level))
      ;
      (in_RDX->nextgc).gcptr32 = MVar3 & 0xff;
      in_RDX->hash = 7;
      return MVar2;
    }
  }
  return 0xffffffff;
}

Assistant:

static MSize var_lookup_(FuncState *fs, GCstr *name, ExpDesc *e, int first)
{
  if (fs) {
    BCReg reg = var_lookup_local(fs, name);
    if ((int32_t)reg >= 0) {  /* Local in this function? */
      expr_init(e, VLOCAL, reg);
      if (!first)
	fscope_uvmark(fs, reg);  /* Scope now has an upvalue. */
      return (MSize)(e->u.s.aux = (uint32_t)fs->varmap[reg]);
    } else {
      MSize vidx = var_lookup_(fs->prev, name, e, 0);  /* Var in outer func? */
      if ((int32_t)vidx >= 0) {  /* Yes, make it an upvalue here. */
	e->u.s.info = (uint8_t)var_lookup_uv(fs, vidx, e);
	e->k = VUPVAL;
	return vidx;
      }
    }
  } else {  /* Not found in any function, must be a global. */
    expr_init(e, VGLOBAL, 0);
    e->u.sval = name;
  }
  return (MSize)-1;  /* Global. */
}